

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiled.cpp
# Opt level: O2

bool __thiscall
Rml::DecoratorTiledInstancer::GetTileProperties
          (DecoratorTiledInstancer *this,Tile *tiles,Texture *textures,size_t num_tiles_and_textures
          ,PropertyDictionary *properties,DecoratorInstancerInterface *instancer_interface)

{
  Vector2Type VVar1;
  Vector2Type VVar2;
  Unit UVar3;
  pointer pTVar4;
  Spritesheet *pSVar5;
  code *pcVar6;
  bool bVar7;
  __type _Var8;
  PropertyId id;
  TileFitMode TVar9;
  int iVar10;
  TileOrientation TVar11;
  Property *pPVar12;
  Sprite *pSVar13;
  RenderManager *render_manager;
  ulong uVar14;
  int dimension;
  Texture *this_00;
  long lVar15;
  float *pfVar16;
  float unaff_R15D;
  float fVar17;
  Vector2f VVar18;
  Texture TVar19;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  RenderManager *local_f0;
  String texture_name;
  String local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  Property *align_properties [2];
  String previous_texture_name;
  
  if ((((long)(this->tile_property_ids).
              super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->tile_property_ids).
             super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
             ._M_impl.super__Vector_impl_data._M_start) / 5 != num_tiles_and_textures) &&
     (bVar7 = Assert("RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                     ,0x11f), !bVar7)) {
LAB_0027ab1d:
    pcVar6 = (code *)invalidInstructionException();
    (*pcVar6)();
  }
  previous_texture_name._M_dataplus._M_p = (pointer)&previous_texture_name.field_2;
  previous_texture_name._M_string_length = 0;
  previous_texture_name.field_2._M_local_buf[0] = '\0';
  pfVar16 = &tiles->align[0].value;
  local_78 = 0xffffffffffffffff;
  uStack_70 = 0xffffffffffffffff;
  local_f0 = (RenderManager *)0x0;
  uVar14 = 0;
  do {
    if (uVar14 == num_tiles_and_textures) {
LAB_0027aaf4:
      ::std::__cxx11::string::~string((string *)&previous_texture_name);
      return num_tiles_and_textures <= uVar14;
    }
    pTVar4 = (this->tile_property_ids).
             super__Vector_base<Rml::DecoratorTiledInstancer::TilePropertyIds,_std::allocator<Rml::DecoratorTiledInstancer::TilePropertyIds>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar12 = PropertyDictionary::GetProperty(properties,pTVar4[uVar14].src);
    Property::Get<std::__cxx11::string>(&texture_name,pPVar12);
    if (texture_name._M_string_length != 0) {
      bVar7 = ::std::operator==(&texture_name,"auto");
      if (!bVar7) {
        pSVar13 = DecoratorInstancerInterface::GetSprite(instancer_interface,&texture_name);
        this_00 = textures + uVar14;
        if (pSVar13 == (Sprite *)0x0) {
          _Var8 = ::std::operator==(&texture_name,&previous_texture_name);
          if (_Var8) {
            this_00->render_manager = local_f0;
            this_00->file_index = (undefined4)local_78;
            this_00->callback_index = local_78._4_4_;
            goto LAB_0027a8a8;
          }
          TVar19 = DecoratorInstancerInterface::GetTexture(instancer_interface,&texture_name);
          *this_00 = TVar19;
          bVar7 = Texture::operator_cast_to_bool(this_00);
          if (bVar7) {
            ::std::__cxx11::string::_M_assign((string *)&previous_texture_name);
            local_f0 = this_00->render_manager;
            local_78._0_4_ = this_00->file_index;
            local_78._4_4_ = this_00->callback_index;
            uStack_70 = 0;
            goto LAB_0027a8a8;
          }
LAB_0027aae5:
          ::std::__cxx11::string::~string((string *)&texture_name);
          goto LAB_0027aaf4;
        }
        fVar17 = (pSVar13->rectangle).p0.y;
        tiles[uVar14].position.x = (pSVar13->rectangle).p0.x;
        tiles[uVar14].position.y = fVar17;
        VVar1 = (pSVar13->rectangle).p0;
        VVar2 = (pSVar13->rectangle).p1;
        VVar18.x = VVar2.x - VVar1.x;
        VVar18.y = VVar2.y - VVar1.y;
        tiles[uVar14].size = VVar18;
        pSVar5 = pSVar13->sprite_sheet;
        tiles[uVar14].display_scale = pSVar5->display_scale;
        render_manager = DecoratorInstancerInterface::GetRenderManager(instancer_interface);
        TVar19 = TextureSource::GetTexture(&pSVar5->texture_source,render_manager);
        *this_00 = TVar19;
LAB_0027a8a8:
        id = pTVar4[uVar14].fit;
        if (id != Invalid) {
          if ((pTVar4[uVar14].align_x == Invalid) || (pTVar4[uVar14].align_y == Invalid)) {
            bVar7 = Assert("RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid)"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DecoratorTiled.cpp"
                           ,0x159);
            if (!bVar7) goto LAB_0027ab1d;
            id = pTVar4[uVar14].fit;
          }
          pPVar12 = PropertyDictionary::GetProperty(properties,id);
          TVar9 = Variant::Get<int>(&pPVar12->value,0);
          tiles[uVar14].fit_mode = TVar9;
          if ((pSVar13 != (Sprite *)0x0) && (TVar9 - REPEAT < 3)) {
            Property::ToString_abi_cxx11_(&local_98,pPVar12);
            Log::Message(LT_WARNING,
                         "Decorator \'fit\' value is \'%s\', which is incompatible with sprites",
                         local_98._M_dataplus._M_p);
            ::std::__cxx11::string::~string((string *)&local_98);
            goto LAB_0027aae5;
          }
          align_properties[0] = PropertyDictionary::GetProperty(properties,pTVar4[uVar14].align_x);
          align_properties[1] = PropertyDictionary::GetProperty(properties,pTVar4[uVar14].align_y);
          for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
            pPVar12 = align_properties[lVar15];
            UVar3 = pPVar12->unit;
            if (UVar3 == PX) {
              fVar17 = Property::Get<float>(pPVar12);
              local_f4 = (float)((uint)local_f4 & 0xffffff00);
              pfVar16[lVar15 * 2 + -1] = local_f4;
LAB_0027a9e8:
              pfVar16[lVar15 * 2] = fVar17;
            }
            else {
              if (UVar3 == PERCENT) {
                fVar17 = Property::Get<float>(pPVar12);
                unaff_R15D = (float)(((uint)unaff_R15D & 0xffffff00) + 1);
                pfVar16[lVar15 * 2 + -1] = unaff_R15D;
                goto LAB_0027a9e8;
              }
              if (UVar3 == KEYWORD) {
                iVar10 = Property::Get<int>(pPVar12);
                if (iVar10 == 0) {
                  local_f8 = (float)(((uint)local_f8 & 0xffffff00) + 1);
                  pfVar16[lVar15 * 2 + -1] = local_f8;
                  pfVar16[lVar15 * 2] = 0.0;
                }
                else if (iVar10 == 1) {
                  local_fc = (float)(((uint)local_fc & 0xffffff00) + 1);
                  pfVar16[lVar15 * 2 + -1] = local_fc;
                  pfVar16[lVar15 * 2] = 50.0;
                }
                else if (iVar10 == 2) {
                  local_100 = (float)(((uint)local_100 & 0xffffff00) + 1);
                  pfVar16[lVar15 * 2 + -1] = local_100;
                  pfVar16[lVar15 * 2] = 100.0;
                }
              }
              else {
                Property::ToString_abi_cxx11_(&local_98,pPVar12);
                Log::Message(LT_WARNING,
                             "Decorator alignment value is \'%s\' which uses an unsupported unit (use px, %%, or keyword)"
                             ,local_98._M_dataplus._M_p);
                ::std::__cxx11::string::~string((string *)&local_98);
              }
            }
          }
        }
        if (pTVar4[uVar14].orientation != Invalid) {
          pPVar12 = PropertyDictionary::GetProperty(properties,pTVar4[uVar14].orientation);
          TVar11 = Variant::Get<int>(&pPVar12->value,0);
          tiles[uVar14].orientation = TVar11;
        }
      }
    }
    ::std::__cxx11::string::~string((string *)&texture_name);
    uVar14 = uVar14 + 1;
    pfVar16 = pfVar16 + 0x13;
  } while( true );
}

Assistant:

bool DecoratorTiledInstancer::GetTileProperties(DecoratorTiled::Tile* tiles, Texture* textures, size_t num_tiles_and_textures,
	const PropertyDictionary& properties, const DecoratorInstancerInterface& instancer_interface) const
{
	RMLUI_ASSERT(num_tiles_and_textures == tile_property_ids.size());

	String previous_texture_name;
	Texture previous_texture;

	for (size_t i = 0; i < num_tiles_and_textures; i++)
	{
		const TilePropertyIds& ids = tile_property_ids[i];

		const Property* src_property = properties.GetProperty(ids.src);
		const String texture_name = src_property->Get<String>();

		// Skip the tile if it has no source name.
		// Declaring the name 'auto' is the same as an empty string. This gives an easy way to skip certain
		// tiles in a shorthand since we can't always declare an empty string.
		if (texture_name.empty() || texture_name == "auto")
			continue;

		// We are required to set default values before instancing the tile, thus, all properties should always be
		// dereferencable. If the debugger captures a zero-dereference, check that all properties for every tile is set
		// and default values are set just before instancing.

		DecoratorTiled::Tile& tile = tiles[i];
		Texture& texture = textures[i];

		const Sprite* sprite = instancer_interface.GetSprite(texture_name);

		// A tile is always either a sprite or an image.
		if (sprite)
		{
			tile.position = sprite->rectangle.Position();
			tile.size = sprite->rectangle.Size();
			tile.display_scale = sprite->sprite_sheet->display_scale;

			texture = sprite->sprite_sheet->texture_source.GetTexture(instancer_interface.GetRenderManager());
		}
		else
		{
			// No sprite found, so assume that the name is an image source. Since the common use case is to specify the
			// same texture for all tiles, check the previous texture first before fetching from the global database.
			if (texture_name == previous_texture_name)
			{
				texture = previous_texture;
			}
			else
			{
				texture = instancer_interface.GetTexture(texture_name);

				if (!texture)
					return false;

				previous_texture_name = texture_name;
				previous_texture = texture;
			}
		}

		if (ids.fit != PropertyId::Invalid)
		{
			RMLUI_ASSERT(ids.align_x != PropertyId::Invalid && ids.align_y != PropertyId::Invalid);
			const Property& fit_property = *properties.GetProperty(ids.fit);
			tile.fit_mode = (DecoratorTiled::TileFitMode)fit_property.value.Get<int>();

			if (sprite &&
				(tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT || tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_X ||
					tile.fit_mode == DecoratorTiled::TileFitMode::REPEAT_Y))
			{
				Log::Message(Log::LT_WARNING, "Decorator 'fit' value is '%s', which is incompatible with sprites", fit_property.ToString().c_str());
				return false;
			}

			const Property* align_properties[2] = {properties.GetProperty(ids.align_x), properties.GetProperty(ids.align_y)};

			for (int dimension = 0; dimension < 2; dimension++)
			{
				using Style::LengthPercentage;

				LengthPercentage& align = tile.align[dimension];
				const Property& property = *align_properties[dimension];
				if (property.unit == Unit::KEYWORD)
				{
					enum { TOP_LEFT, CENTER, BOTTOM_RIGHT };
					switch (property.Get<int>())
					{
					case TOP_LEFT: align = LengthPercentage(LengthPercentage::Percentage, 0.0f); break;
					case CENTER: align = LengthPercentage(LengthPercentage::Percentage, 50.0f); break;
					case BOTTOM_RIGHT: align = LengthPercentage(LengthPercentage::Percentage, 100.0f); break;
					}
				}
				else if (property.unit == Unit::PERCENT)
				{
					align = LengthPercentage(LengthPercentage::Percentage, property.Get<float>());
				}
				else if (property.unit == Unit::PX)
				{
					align = LengthPercentage(LengthPercentage::Length, property.Get<float>());
				}
				else
				{
					Log::Message(Log::LT_WARNING, "Decorator alignment value is '%s' which uses an unsupported unit (use px, %%, or keyword)",
						property.ToString().c_str());
				}
			}
		}

		if (ids.orientation != PropertyId::Invalid)
		{
			const Property& orientation_property = *properties.GetProperty(ids.orientation);
			tile.orientation = (DecoratorTiled::TileOrientation)orientation_property.value.Get<int>();
		}
	}

	return true;
}